

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_builtins.cpp
# Opt level: O0

spv_result_t __thiscall
spvtools::val::anon_unknown_0::BuiltInsValidator::ValidateMeshShadingEXTBuiltinsAtReference
          (BuiltInsValidator *this,Decoration *decoration,Instruction *built_in_inst,
          Instruction *referenced_inst,Instruction *referenced_from_inst)

{
  bool bVar1;
  spv_const_context psVar2;
  DiagnosticStream *pDVar3;
  AssemblyGrammar *pAVar4;
  reference pEVar5;
  mapped_type *this_00;
  BuiltInsValidator *local_698;
  code *local_690;
  undefined8 local_688;
  type local_680;
  value_type local_530;
  uint32_t local_50c;
  string local_508;
  char *local_4e8;
  string local_4e0;
  string local_4c0;
  DiagnosticStream local_4a0;
  uint32_t local_2c8;
  ExecutionModel local_2c4;
  uint32_t vuid_1;
  ExecutionModel execution_model;
  iterator __end3;
  iterator __begin3;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *__range3;
  string local_288;
  char *local_268;
  string local_260;
  string local_240;
  DiagnosticStream local_220;
  uint32_t local_44;
  StorageClass local_40;
  uint32_t vuid;
  StorageClass storage_class;
  BuiltIn builtin;
  Instruction *referenced_from_inst_local;
  Instruction *referenced_inst_local;
  Instruction *built_in_inst_local;
  Decoration *decoration_local;
  BuiltInsValidator *this_local;
  
  _storage_class = referenced_from_inst;
  referenced_from_inst_local = referenced_inst;
  referenced_inst_local = built_in_inst;
  built_in_inst_local = (Instruction *)decoration;
  decoration_local = (Decoration *)this;
  psVar2 = ValidationState_t::context(this->_);
  bVar1 = spvIsVulkanEnv(psVar2->target_env);
  if (bVar1) {
    vuid = Decoration::builtin((Decoration *)built_in_inst_local);
    local_40 = GetStorageClass(_storage_class);
    if ((local_40 != Max) && (local_40 != Output)) {
      local_44 = GetVUIDForBuiltin(vuid,VUIDErrorStorageClass);
      ValidationState_t::diag(&local_220,this->_,SPV_ERROR_INVALID_DATA,_storage_class);
      ValidationState_t::VkErrorID_abi_cxx11_(&local_240,this->_,local_44,(char *)0x0);
      pDVar3 = DiagnosticStream::operator<<(&local_220,&local_240);
      psVar2 = ValidationState_t::context(this->_);
      spvLogStringForEnv_abi_cxx11_(&local_260,psVar2->target_env);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_260);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [22])0xf2c5e7);
      pAVar4 = ValidationState_t::grammar(this->_);
      local_268 = AssemblyGrammar::lookupOperandName(pAVar4,SPV_OPERAND_TYPE_BUILT_IN,vuid);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_268);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [59])0xf2ccfc);
      (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                (&local_288,this,(Decoration *)built_in_inst_local,referenced_inst_local,
                 referenced_from_inst_local,_storage_class,ExecutionModelMax);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_288);
      pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [2])0xf43b35);
      (anonymous_namespace)::BuiltInsValidator::GetStorageClassDesc_abi_cxx11_
                ((string *)&__range3,this,_storage_class);
      pDVar3 = DiagnosticStream::operator<<
                         (pDVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&__range3);
      this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      std::__cxx11::string::~string((string *)&__range3);
      std::__cxx11::string::~string((string *)&local_288);
      std::__cxx11::string::~string((string *)&local_260);
      std::__cxx11::string::~string((string *)&local_240);
      DiagnosticStream::~DiagnosticStream(&local_220);
      return this_local._4_4_;
    }
    __end3 = std::
             set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
             ::begin(&this->execution_models_);
    _vuid_1 = std::
              set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
              ::end(&this->execution_models_);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&vuid_1), bVar1) {
      pEVar5 = std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator*(&__end3);
      local_2c4 = *pEVar5;
      if (local_2c4 != ExecutionModelMeshEXT) {
        local_2c8 = GetVUIDForBuiltin(vuid,VUIDErrorExecutionModel);
        ValidationState_t::diag(&local_4a0,this->_,SPV_ERROR_INVALID_DATA,_storage_class);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_4c0,this->_,local_2c8,(char *)0x0);
        pDVar3 = DiagnosticStream::operator<<(&local_4a0,&local_4c0);
        psVar2 = ValidationState_t::context(this->_);
        spvLogStringForEnv_abi_cxx11_(&local_4e0,psVar2->target_env);
        pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_4e0);
        pDVar3 = DiagnosticStream::operator<<(pDVar3,(char (*) [22])0xf2c5e7);
        pAVar4 = ValidationState_t::grammar(this->_);
        local_4e8 = AssemblyGrammar::lookupOperandName(pAVar4,SPV_OPERAND_TYPE_BUILT_IN,vuid);
        pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_4e8);
        pDVar3 = DiagnosticStream::operator<<
                           (pDVar3,(char (*) [48])" to be used only with MeshEXT execution model. ")
        ;
        (anonymous_namespace)::BuiltInsValidator::GetReferenceDesc_abi_cxx11_
                  (&local_508,this,(Decoration *)built_in_inst_local,referenced_inst_local,
                   referenced_from_inst_local,_storage_class,local_2c4);
        pDVar3 = DiagnosticStream::operator<<(pDVar3,&local_508);
        this_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
        std::__cxx11::string::~string((string *)&local_508);
        std::__cxx11::string::~string((string *)&local_4e0);
        std::__cxx11::string::~string((string *)&local_4c0);
        DiagnosticStream::~DiagnosticStream(&local_4a0);
        return this_local._4_4_;
      }
      std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator++(&__end3);
    }
  }
  if (this->function_id_ == 0) {
    local_50c = val::Instruction::id(_storage_class);
    this_00 = std::
              map<unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>_>_>_>
              ::operator[](&this->id_to_at_reference_checks_,&local_50c);
    local_690 = ValidateMeshShadingEXTBuiltinsAtReference;
    local_688 = 0;
    local_698 = this;
    std::
    bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*)(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&),spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,std::_Placeholder<1>const&>
              (&local_680,(offset_in_BuiltInsValidator_to_subr *)&local_690,&local_698,
               (Decoration *)built_in_inst_local,referenced_inst_local,_storage_class,
               (_Placeholder<1> *)&std::placeholders::_1);
    std::function<spv_result_t(spvtools::val::Instruction_const&)>::
    function<std::_Bind<spv_result_t(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator*,spvtools::val::Decoration,spvtools::val::Instruction,spvtools::val::Instruction,std::_Placeholder<1>))(spvtools::val::Decoration_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&,spvtools::val::Instruction_const&)>,void>
              ((function<spv_result_t(spvtools::val::Instruction_const&)> *)&local_530,&local_680);
    std::__cxx11::
    list<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>,_std::allocator<std::function<spv_result_t_(const_spvtools::val::Instruction_&)>_>_>
    ::push_back(this_00,&local_530);
    std::function<spv_result_t_(const_spvtools::val::Instruction_&)>::~function(&local_530);
    std::
    _Bind<spv_result_t_(spvtools::val::(anonymous_namespace)::BuiltInsValidator::*(spvtools::val::(anonymous_namespace)::BuiltInsValidator_*,_spvtools::val::Decoration,_spvtools::val::Instruction,_spvtools::val::Instruction,_std::_Placeholder<1>))(const_spvtools::val::Decoration_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&,_const_spvtools::val::Instruction_&)>
    ::~_Bind(&local_680);
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t BuiltInsValidator::ValidateMeshShadingEXTBuiltinsAtReference(
    const Decoration& decoration, const Instruction& built_in_inst,
    const Instruction& referenced_inst,
    const Instruction& referenced_from_inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const spv::BuiltIn builtin = decoration.builtin();
    const spv::StorageClass storage_class =
        GetStorageClass(referenced_from_inst);
    if (storage_class != spv::StorageClass::Max &&
        storage_class != spv::StorageClass::Output) {
      uint32_t vuid = GetVUIDForBuiltin(builtin, VUIDErrorStorageClass);
      return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
             << _.VkErrorID(vuid) << spvLogStringForEnv(_.context()->target_env)
             << " spec allows BuiltIn "
             << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                              uint32_t(builtin))
             << " to be only used for variables with Output storage class. "
             << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                 referenced_from_inst)
             << " " << GetStorageClassDesc(referenced_from_inst);
    }
    for (const spv::ExecutionModel execution_model : execution_models_) {
      if (execution_model != spv::ExecutionModel::MeshEXT) {
        uint32_t vuid = GetVUIDForBuiltin(builtin, VUIDErrorExecutionModel);
        return _.diag(SPV_ERROR_INVALID_DATA, &referenced_from_inst)
               << _.VkErrorID(vuid)
               << spvLogStringForEnv(_.context()->target_env)
               << " spec allows BuiltIn "
               << _.grammar().lookupOperandName(SPV_OPERAND_TYPE_BUILT_IN,
                                                uint32_t(builtin))
               << " to be used only with MeshEXT execution model. "
               << GetReferenceDesc(decoration, built_in_inst, referenced_inst,
                                   referenced_from_inst, execution_model);
      }
    }
  }

  if (function_id_ == 0) {
    // Propagate this rule to all dependant ids in the global scope.
    id_to_at_reference_checks_[referenced_from_inst.id()].push_back(
        std::bind(&BuiltInsValidator::ValidateMeshShadingEXTBuiltinsAtReference,
                  this, decoration, built_in_inst, referenced_from_inst,
                  std::placeholders::_1));
  }

  return SPV_SUCCESS;
}